

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::ScannersMixin::Print(ScannersMixin *this,DebugWriter *w,char16 *litbuf)

{
  ScannerInfo *this_00;
  long lVar1;
  
  DebugWriter::Print(w,L"literals: {");
  if (0 < this->numLiterals) {
    lVar1 = 0;
    do {
      if (lVar1 != 0) {
        DebugWriter::Print(w,L", ");
      }
      this_00 = this->infos[lVar1].ptr;
      LiteralMixin::Print((LiteralMixin *)this_00,w,litbuf,this_00->isEquivClass);
      DebugWriter::Print(w,L" (with %s scanner)",L"full map Boyer-Moore");
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->numLiterals);
  }
  DebugWriter::Print(w,L"}");
  return;
}

Assistant:

void ScannersMixin::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->Print(_u("literals: {"));
        for (int i = 0; i < numLiterals; i++)
        {
            if (i > 0)
            {
                w->Print(_u(", "));
            }
            infos[i]->Print(w, litbuf);
        }
        w->Print(_u("}"));
    }